

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loguru.cpp
# Opt level: O3

bool loguru::remove_callback(char *id)

{
  Callback *pCVar1;
  int iVar2;
  Callback *pCVar3;
  undefined8 uVar4;
  long lVar5;
  long lVar6;
  iterator __position;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double extraout_XMM0_Qa_03;
  double extraout_XMM0_Qa_04;
  double extraout_XMM0_Qa_05;
  double extraout_XMM0_Qa_06;
  double __x;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)s_mutex);
  pCVar1 = DAT_00145b30;
  if (iVar2 != 0) {
    uVar4 = std::__throw_system_error(iVar2);
    pthread_mutex_unlock((pthread_mutex_t *)s_mutex);
    _Unwind_Resume(uVar4);
  }
  lVar5 = (long)DAT_00145b30 - (long)s_callbacks;
  lVar6 = (lVar5 >> 4) * -0x3333333333333333 >> 2;
  pCVar3 = s_callbacks;
  __x = extraout_XMM0_Qa;
  if (0 < lVar6) {
    lVar6 = lVar6 + 1;
    do {
      iVar2 = std::__cxx11::string::compare((char *)pCVar3);
      __position._M_current = pCVar3;
      __x = extraout_XMM0_Qa_00;
      if (iVar2 == 0) goto LAB_0012c648;
      iVar2 = std::__cxx11::string::compare((char *)(pCVar3 + 1));
      __position._M_current = pCVar3 + 1;
      __x = extraout_XMM0_Qa_01;
      if (iVar2 == 0) goto LAB_0012c648;
      iVar2 = std::__cxx11::string::compare((char *)(pCVar3 + 2));
      __position._M_current = pCVar3 + 2;
      __x = extraout_XMM0_Qa_02;
      if (iVar2 == 0) goto LAB_0012c648;
      iVar2 = std::__cxx11::string::compare((char *)(pCVar3 + 3));
      __position._M_current = pCVar3 + 3;
      __x = extraout_XMM0_Qa_03;
      if (iVar2 == 0) goto LAB_0012c648;
      pCVar3 = pCVar3 + 4;
      lVar6 = lVar6 + -1;
      lVar5 = lVar5 + -0x140;
    } while (1 < lVar6);
  }
  lVar5 = (lVar5 >> 4) * -0x3333333333333333;
  if (lVar5 != 1) {
    if (lVar5 != 2) {
      __position._M_current = pCVar1;
      if ((lVar5 != 3) ||
         (iVar2 = std::__cxx11::string::compare((char *)pCVar3), __position._M_current = pCVar3,
         __x = extraout_XMM0_Qa_04, iVar2 == 0)) goto LAB_0012c648;
      pCVar3 = pCVar3 + 1;
    }
    iVar2 = std::__cxx11::string::compare((char *)pCVar3);
    __position._M_current = pCVar3;
    __x = extraout_XMM0_Qa_05;
    if (iVar2 == 0) goto LAB_0012c648;
    pCVar3 = pCVar3 + 1;
  }
  iVar2 = std::__cxx11::string::compare((char *)pCVar3);
  __position._M_current = pCVar1;
  __x = extraout_XMM0_Qa_06;
  if (iVar2 == 0) {
    __position._M_current = pCVar3;
  }
LAB_0012c648:
  pCVar1 = DAT_00145b30;
  if (__position._M_current == DAT_00145b30) {
    iVar2 = s_max_out_verbosity;
    if (s_max_out_verbosity < g_stderr_verbosity) {
      iVar2 = g_stderr_verbosity;
    }
    if (-3 < iVar2) {
      log(__x);
    }
  }
  else {
    if ((__position._M_current)->close != (close_handler_t)0x0) {
      (*(__position._M_current)->close)((__position._M_current)->user_data);
    }
    std::vector<loguru::Callback,_std::allocator<loguru::Callback>_>::_M_erase
              ((vector<loguru::Callback,_std::allocator<loguru::Callback>_> *)&s_callbacks,
               __position);
    s_max_out_verbosity = -9;
    if (s_callbacks != DAT_00145b30) {
      s_max_out_verbosity = -9;
      pCVar3 = s_callbacks;
      do {
        iVar2 = pCVar3->verbosity;
        if (pCVar3->verbosity < s_max_out_verbosity) {
          iVar2 = s_max_out_verbosity;
        }
        s_max_out_verbosity = iVar2;
        pCVar3 = pCVar3 + 1;
      } while (pCVar3 != DAT_00145b30);
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)s_mutex);
  return __position._M_current != pCVar1;
}

Assistant:

bool remove_callback(const char* id)
	{
		std::lock_guard<std::recursive_mutex> lock(s_mutex);
		auto it = std::find_if(begin(s_callbacks), end(s_callbacks), [&](const Callback& c) { return c.id == id; });
		if (it != s_callbacks.end()) {
			if (it->close) { it->close(it->user_data); }
			s_callbacks.erase(it);
			on_callback_change();
			return true;
		} else {
			LOG_F(ERROR, "Failed to locate callback with id '" LOGURU_FMT(s) "'", id);
			return false;
		}
	}